

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::SupportVectorClassifier::MergePartialFromCodedStream
          (SupportVectorClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  Kernel *value;
  Int64Vector *value_00;
  StringVector *value_01;
  Coefficients *value_02;
  SparseSupportVectors *value_03;
  DenseSupportVectors *value_04;
  RepeatedField<double> *pRVar6;
  char cVar7;
  uint uVar8;
  ulong uVar9;
  
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar9 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar8, (~(uint)*pbVar1 & uVar8) < 0x80))
        goto LAB_001f5cf3;
        uVar9 = (ulong)((uVar8 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar9 = uVar9 | 0x100000000;
    }
    else {
LAB_001f5cf3:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto LAB_001f5b1c;
    uVar8 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar7 = (char)uVar9;
    switch(uVar8) {
    case 1:
      if (cVar7 != '\n') goto LAB_001f5b1c;
      value = mutable_kernel(this);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::Kernel>(input,value);
      break;
    case 2:
      if (cVar7 == '\x10') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (1,0x12,input,&this->numberofsupportvectorsperclass_);
      }
      else {
        if ((uVar5 & 0xff) != 0x12) goto LAB_001f5b1c;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          (input,&this->numberofsupportvectorsperclass_);
      }
      break;
    case 3:
      if (cVar7 != '\x1a') goto LAB_001f5b1c;
      value_03 = mutable_sparsesupportvectors(this);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::SparseSupportVectors>(input,value_03);
      break;
    case 4:
      if (cVar7 != '\"') goto LAB_001f5b1c;
      value_04 = mutable_densesupportvectors(this);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::DenseSupportVectors>(input,value_04);
      break;
    case 5:
      if (cVar7 != '*') goto LAB_001f5b1c;
      value_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::Add
                           (&this->coefficients_);
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::Coefficients>(input,value_02);
      break;
    case 6:
      if (cVar7 == '1') {
        uVar5 = 0x32;
        pRVar6 = &this->rho_;
LAB_001f5ce9:
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,uVar5,input,pRVar6);
      }
      else {
        pRVar6 = &this->rho_;
        if ((uVar5 & 0xff) != 0x32) goto LAB_001f5b1c;
LAB_001f5c9e:
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,pRVar6);
      }
      break;
    case 7:
      if (cVar7 == '9') {
        uVar5 = 0x3a;
        pRVar6 = &this->proba_;
        goto LAB_001f5ce9;
      }
      pRVar6 = &this->proba_;
      if ((uVar5 & 0xff) == 0x3a) goto LAB_001f5c9e;
      goto LAB_001f5b1c;
    case 8:
      if (cVar7 == 'A') {
        uVar5 = 0x42;
        pRVar6 = &this->probb_;
        goto LAB_001f5ce9;
      }
      pRVar6 = &this->probb_;
      if ((uVar5 & 0xff) == 0x42) goto LAB_001f5c9e;
LAB_001f5b1c:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
      break;
    default:
      if (uVar8 == 100) {
        if (cVar7 != '\"') goto LAB_001f5b1c;
        value_01 = mutable_stringclasslabels(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::StringVector>(input,value_01);
      }
      else {
        if ((uVar8 != 0x65) || (cVar7 != '*')) goto LAB_001f5b1c;
        value_00 = mutable_int64classlabels(this);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input,value_00);
      }
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool SupportVectorClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.SupportVectorClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.Kernel kernel = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_kernel()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated int32 numberOfSupportVectorsPerClass = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_numberofsupportvectorsperclass())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18u, input, this->mutable_numberofsupportvectorsperclass())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sparsesupportvectors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_densesupportvectors()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.Coefficients coefficients = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_coefficients()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double rho = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_rho())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(49u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 50u, input, this->mutable_rho())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double probA = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_proba())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(57u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 58u, input, this->mutable_proba())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double probB = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_probb())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(65u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 66u, input, this->mutable_probb())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.SupportVectorClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.SupportVectorClassifier)
  return false;
#undef DO_
}